

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::disposeImpl
          (HeapDisposer<capnp::_::BuilderArena::MultiSegmentState> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 0x20);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0x28);
      lVar3 = *(long *)((long)pointer + 0x30);
      *(undefined8 *)((long)pointer + 0x20) = 0;
      *(undefined8 *)((long)pointer + 0x28) = 0;
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x38))
                (*(undefined8 **)((long)pointer + 0x38),lVar1,0x10,lVar2 - lVar1 >> 4,
                 lVar3 - lVar1 >> 4,0);
    }
    lVar1 = *pointer;
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 8);
      lVar3 = *(long *)((long)pointer + 0x10);
      *(undefined8 *)pointer = 0;
      *(undefined8 *)((long)pointer + 8) = 0;
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),lVar1,0x10,lVar2 - lVar1 >> 4,
                 lVar3 - lVar1 >> 4,
                 ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
    }
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }